

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_state_redistribute.cpp
# Opt level: O0

void Redistribution::StateRedistribute
               (Box *bx,int ncomp,Array4<double> *U_out,Array4<double> *U_in,
               Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *vfrac,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccent,BCRec *d_bcrec_ptr,Array4<const_int> *itracker,
               Array4<const_double> *nrs,Array4<const_double> *alpha,Array4<const_double> *nbhd_vol,
               Array4<const_double> *cent_hat,Geometry *lev_geom,int max_order)

{
  Box *pBVar1;
  void *in_RCX;
  void *in_RDX;
  undefined4 in_ESI;
  int *in_RDI;
  void *in_R8;
  void *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000030;
  void *in_stack_00000038;
  void *in_stack_00000040;
  void *in_stack_00000048;
  void *in_stack_00000050;
  Geometry *in_stack_00000058;
  undefined4 in_stack_00000060;
  Elixir eli_soln_hat;
  Array4<double> soln_hat;
  FArrayBox soln_hat_fab;
  Box domain_per_grown;
  Box result_2;
  Box *bxg3;
  Box result_1;
  Box *bxg2;
  Box result;
  Box *bxg1;
  bool *is_periodic_z;
  bool *is_periodic_y;
  bool *is_periodic_x;
  int domain_khi;
  int domain_klo;
  int domain_jhi;
  int domain_jlo;
  int domain_ihi;
  int domain_ilo;
  Box domain;
  GpuArray<int,_27U> kmap;
  GpuArray<int,_27U> jmap;
  GpuArray<int,_27U> imap;
  Arena *in_stack_fffffffffffff308;
  Elixir *this;
  Box *in_stack_fffffffffffff318;
  FArrayBox *in_stack_fffffffffffff320;
  BaseFab<double> *in_stack_fffffffffffff338;
  anon_class_192_3_987890db *in_stack_fffffffffffff350;
  undefined4 in_stack_fffffffffffff358;
  int in_stack_fffffffffffff35c;
  Box *in_stack_fffffffffffff360;
  undefined1 auStack_c88 [64];
  undefined1 auStack_c48 [64];
  undefined1 local_c08 [64];
  undefined1 auStack_bc8 [64];
  undefined8 local_b88;
  undefined8 local_b80;
  undefined8 local_b78;
  int local_b70;
  undefined4 local_b6c;
  undefined1 auStack_b68 [64];
  undefined1 auStack_b28 [64];
  undefined1 auStack_ae8 [64];
  undefined1 auStack_aa8 [72];
  undefined1 auStack_a60 [64];
  undefined1 auStack_a20 [64];
  undefined1 auStack_9e0 [64];
  undefined1 auStack_9a0 [64];
  undefined1 auStack_960 [64];
  int local_920;
  int local_91c;
  int local_918;
  int local_914;
  int local_910;
  int local_90c;
  undefined4 local_908;
  undefined1 auStack_900 [64];
  undefined1 auStack_8c0 [108];
  undefined1 auStack_854 [108];
  undefined1 auStack_7e8 [112];
  undefined4 local_778;
  undefined1 auStack_770 [64];
  undefined1 auStack_730 [64];
  undefined1 auStack_6f0 [64];
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  uint local_698;
  int local_694 [4];
  int local_684 [2];
  uint local_67c;
  undefined1 auStack_678 [64];
  undefined1 auStack_638 [64];
  undefined1 auStack_5f8 [108];
  undefined1 auStack_58c [108];
  undefined1 auStack_520 [112];
  undefined1 auStack_4b0 [64];
  undefined1 auStack_470 [88];
  Array4<double> local_418;
  Elixir local_3d8 [3];
  Box local_390;
  Box local_374;
  Box *local_358;
  Box local_34c;
  Box *local_330;
  Box local_324;
  Box *local_308;
  byte local_2f9;
  byte *local_2f8;
  byte local_2e9;
  byte *local_2e8;
  byte local_2d9;
  byte *local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  Box local_2b8;
  undefined1 local_29c [108];
  undefined1 local_230 [108];
  undefined1 local_1c4 [108];
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  int *local_120;
  undefined4 local_114;
  int *local_110;
  undefined4 local_104;
  int *local_100;
  Elixir *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  pointer local_d0;
  int local_c8;
  pointer local_c0;
  int local_b8;
  int local_b4;
  Elixir *local_b0;
  pointer local_a8;
  pointer local_a0;
  int local_98;
  Elixir *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  Elixir *local_78;
  undefined4 local_6c;
  Elixir *local_68;
  undefined4 local_5c;
  Elixir *local_58;
  Dim3 local_50;
  Elixir *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_158 = in_R9;
  local_150 = in_R8;
  local_148 = in_RCX;
  local_140 = in_RDX;
  local_134 = in_ESI;
  local_130 = in_RDI;
  memcpy(local_1c4,&DAT_01959c44,0x6c);
  memcpy(local_230,&DAT_01959cb0,0x6c);
  memcpy(local_29c,&DAT_01959d1c,0x6c);
  pBVar1 = amrex::Geometry::Domain(in_stack_00000058);
  local_2b8.smallend.vect._0_8_ = *(undefined8 *)(pBVar1->smallend).vect;
  local_2b8._8_8_ = *(undefined8 *)((pBVar1->smallend).vect + 2);
  local_2b8.bigend.vect._4_8_ = *(undefined8 *)((pBVar1->bigend).vect + 1);
  local_2b8.btype.itype = (pBVar1->btype).itype;
  local_2bc = amrex::Box::smallEnd(&local_2b8,0);
  local_2c0 = amrex::Box::bigEnd(&local_2b8,0);
  local_2c4 = amrex::Box::smallEnd(&local_2b8,1);
  local_2c8 = amrex::Box::bigEnd(&local_2b8,1);
  local_2cc = amrex::Box::smallEnd(&local_2b8,2);
  local_2d0 = amrex::Box::bigEnd(&local_2b8,2);
  local_2d9 = amrex::Geometry::isPeriodic(in_stack_00000058,0);
  local_2d8 = &local_2d9;
  local_2e9 = amrex::Geometry::isPeriodic(in_stack_00000058,1);
  local_2e8 = &local_2e9;
  local_2f9 = amrex::Geometry::isPeriodic(in_stack_00000058,2);
  local_2f8 = &local_2f9;
  local_100 = local_130;
  local_104 = 1;
  local_324.smallend.vect._0_8_ = *(undefined8 *)local_130;
  local_324.smallend.vect[2] = local_130[2];
  local_324.bigend.vect[0] = local_130[3];
  local_324.bigend.vect._4_8_ = *(undefined8 *)(local_130 + 4);
  local_324.btype.itype = local_130[6];
  amrex::Box::grow(&local_324,1);
  local_308 = &local_324;
  local_110 = local_130;
  local_114 = 2;
  local_34c.smallend.vect._0_8_ = *(undefined8 *)local_130;
  local_34c.smallend.vect[2] = local_130[2];
  local_34c.bigend.vect[0] = local_130[3];
  local_34c.bigend.vect._4_8_ = *(undefined8 *)(local_130 + 4);
  local_34c.btype.itype = local_130[6];
  amrex::Box::grow(&local_34c,2);
  local_330 = &local_34c;
  local_120 = local_130;
  local_124 = 3;
  local_374.smallend.vect._0_8_ = *(undefined8 *)local_130;
  local_374.smallend.vect[2] = local_130[2];
  local_374.bigend.vect[0] = local_130[3];
  local_374.bigend.vect._4_8_ = *(undefined8 *)(local_130 + 4);
  local_374.btype.itype = local_130[6];
  amrex::Box::grow(&local_374,3);
  local_358 = &local_374;
  local_390.smallend.vect[0] = local_2b8.smallend.vect[0];
  local_390.smallend.vect[1] = local_2b8.smallend.vect[1];
  local_390.smallend.vect[2] = local_2b8.smallend.vect[2];
  local_390.bigend.vect[0] = local_2b8.bigend.vect[0];
  local_390.bigend.vect[1] = local_2b8.bigend.vect[1];
  local_390.bigend.vect[2] = local_2b8.bigend.vect[2];
  local_390.btype.itype = local_2b8.btype.itype;
  if ((*local_2d8 & 1) != 0) {
    amrex::Box::grow(&local_390,0,2);
  }
  if ((*local_2e8 & 1) != 0) {
    amrex::Box::grow(&local_390,1,2);
  }
  if ((*local_2f8 & 1) != 0) {
    amrex::Box::grow(&local_390,2,2);
  }
  this = local_3d8;
  amrex::FArrayBox::FArrayBox
            (in_stack_fffffffffffff320,in_stack_fffffffffffff318,(int)((ulong)this >> 0x20),
             SUB81((ulong)this >> 0x18,0),SUB81((ulong)this >> 0x10,0),in_stack_fffffffffffff308);
  local_a8 = (this->m_pa).
             super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
             .
             super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b0 = this + 1;
  local_b4 = *(int *)((long)&this[2].m_pa.
                             super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                             .
                             super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4);
  local_5c = 0;
  local_88 = *(undefined4 *)
              &(local_b0->m_pa).
               super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
               .
               super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_6c = 1;
  uStack_84 = *(undefined4 *)
               ((long)&this[1].m_pa.
                       super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                       .
                       super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
  local_d0 = (local_b0->m_pa).
             super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
             .
             super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_7c = 2;
  local_c8 = *(int *)&this[1].m_pa.
                      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                      .
                      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  local_8 = (int *)((long)&this[1].m_pa.
                           super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                           .
                           super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 4);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = (undefined1 *)
             ((long)&this[1].m_pa.
                     super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                     .
                     super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4);
  local_1c = 1;
  iStack_34 = *(int *)&this[1].m_pa.
                       super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                       .
                       super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  local_28 = (undefined1 *)
             ((long)&this[1].m_pa.
                     super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                     .
                     super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4);
  local_2c = 2;
  local_f0.z = *(int *)((long)&this[1].m_pa.
                               super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               .
                               super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_f8 = this;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0 = local_d0;
  local_b8 = local_c8;
  local_a0 = local_d0;
  local_98 = local_c8;
  local_90 = local_b0;
  local_80 = local_c8;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  amrex::Array4<double>::Array4(&local_418,(double *)local_a8,(Dim3 *)&local_c0,&local_dc,local_b4);
  amrex::BaseFab<double>::elixir<double,_0>(in_stack_fffffffffffff338);
  local_778 = local_134;
  memcpy(auStack_770,&local_418,0x3c);
  memcpy(auStack_730,local_148,0x3c);
  memcpy(auStack_6f0,local_158,0x3c);
  local_6b0 = *(undefined8 *)(local_330->smallend).vect;
  local_6a8 = *(undefined8 *)((local_330->smallend).vect + 2);
  local_6a0 = *(undefined8 *)((local_330->bigend).vect + 1);
  local_698 = (local_330->btype).itype;
  local_694[0] = local_390.smallend.vect[0];
  local_694[1] = local_390.smallend.vect[1];
  local_694[2] = local_390.smallend.vect[2];
  local_694[3] = local_390.bigend.vect[0];
  local_684[0] = local_390.bigend.vect[1];
  local_684[1] = local_390.bigend.vect[2];
  local_67c = local_390.btype.itype;
  memcpy(auStack_678,in_stack_00000040,0x3c);
  memcpy(auStack_638,in_stack_00000030,0x3c);
  memcpy(auStack_5f8,local_1c4,0x6c);
  memcpy(auStack_58c,local_230,0x6c);
  memcpy(auStack_520,local_29c,0x6c);
  memcpy(auStack_4b0,in_stack_00000038,0x3c);
  memcpy(auStack_470,in_stack_00000048,0x3c);
  amrex::
  ParallelFor<Redistribution::StateRedistribute(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::BCRec_const*,amrex::Array4<int_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,int)::__0>
            (in_stack_fffffffffffff360,
             (anon_class_840_13_515154a0 *)
             CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
  memcpy(local_c08,local_158,0x3c);
  memcpy(auStack_bc8,in_stack_00000030,0x3c);
  local_b88 = *(undefined8 *)local_130;
  local_b80 = *(undefined8 *)(local_130 + 2);
  local_b78 = *(undefined8 *)(local_130 + 4);
  local_b70 = local_130[6];
  local_b6c = local_134;
  memcpy(auStack_b68,local_140,0x3c);
  memcpy(auStack_b28,in_stack_00000040,0x3c);
  memcpy(auStack_ae8,in_stack_00000038,0x3c);
  memcpy(auStack_aa8,&local_418,0x3c);
  memcpy(auStack_a60,local_150,0x3c);
  memcpy(auStack_a20,in_stack_00000050,0x3c);
  memcpy(auStack_9e0,in_stack_00000008,0x3c);
  memcpy(auStack_9a0,in_stack_00000010,0x3c);
  memcpy(auStack_960,in_stack_00000018,0x3c);
  local_920 = local_2bc;
  local_91c = local_2c4;
  local_918 = local_2cc;
  local_914 = local_2c0;
  local_910 = local_2c8;
  local_90c = local_2d0;
  local_908 = in_stack_00000060;
  memcpy(auStack_900,in_stack_00000020,0x3c);
  memcpy(auStack_8c0,local_1c4,0x6c);
  memcpy(auStack_854,local_230,0x6c);
  memcpy(auStack_7e8,local_29c,0x6c);
  amrex::
  ParallelFor<Redistribution::StateRedistribute(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::BCRec_const*,amrex::Array4<int_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,int)::__1>
            (in_stack_fffffffffffff360,
             (anon_class_1168_25_229d2891 *)
             CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
  memcpy(&stack0xfffffffffffff338,local_150,0x3c);
  memcpy(auStack_c88,in_stack_00000038,0x3c);
  memcpy(auStack_c48,local_140,0x3c);
  amrex::
  ParallelFor<int,Redistribution::StateRedistribute(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::BCRec_const*,amrex::Array4<int_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,int)::__2,void>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff35c,in_stack_fffffffffffff350);
  amrex::Gpu::Elixir::~Elixir(this);
  amrex::FArrayBox::~FArrayBox((FArrayBox *)0xa049d6);
  return;
}

Assistant:

void
Redistribution::StateRedistribute ( Box const& bx, int ncomp,
                                    Array4<Real> const& U_out,
                                    Array4<Real> const& U_in,
                                    Array4<EBCellFlag const> const& flag,
                                    Array4<Real const> const& vfrac,
                                    AMREX_D_DECL(Array4<Real const> const& fcx,
                                                 Array4<Real const> const& fcy,
                                                 Array4<Real const> const& fcz),
                                    Array4<Real const> const& ccent,
                                    amrex::BCRec  const* d_bcrec_ptr,
                                    Array4< int const> const& itracker,
                                    Array4<Real const> const& nrs,
                                    Array4<Real const> const& alpha,
                                    Array4<Real const> const& nbhd_vol,
                                    Array4<Real const> const& cent_hat,
                                    Geometry const& lev_geom,
                                    const int max_order)
{
    // Note that itracker has {4 in 2D, 8 in 3D} components and all are initialized to zero
    // We will add to the first component every time this cell is included in a merged neighborhood,
    //    either by merging or being merged
    //
    // In 2D, we identify the cells in the remaining three components with the following ordering
    //
    // ^  6 7 8
    // |  4   5
    // j  1 2 3
    //   i --->
    //
    // In 3D, We identify the cells in the remaining three components with the following ordering
    //
    //    at k-1   |   at k  |   at k+1
    //
    // ^  15 16 17 |  6 7 8  |  24 25 26
    // |  12 13 14 |  4   5  |  21 22 23
    // j  9  10 11 |  1 2 3  |  18 19 20
    //   i --->
    //
    // Note the first component of each of these arrays should never be used
    //
#if (AMREX_SPACEDIM == 2)
    amrex::GpuArray<int,9> imap{0,-1, 0, 1,-1, 1,-1, 0, 1};
    amrex::GpuArray<int,9> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1};
    amrex::GpuArray<int,9> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0};
#else
    amrex::GpuArray<int,27> imap{0,-1, 0, 1,-1, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1};
    amrex::GpuArray<int,27> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1};
    amrex::GpuArray<int,27> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0,-1,-1,-1,-1,-1,-1,-1,-1,-1, 1, 1, 1, 1, 1, 1, 1, 1, 1};
#endif

    const Box domain = lev_geom.Domain();
    const int domain_ilo = domain.smallEnd(0);
    const int domain_ihi = domain.bigEnd(0);
    const int domain_jlo = domain.smallEnd(1);
    const int domain_jhi = domain.bigEnd(1);
#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain.smallEnd(2);
    const int domain_khi = domain.bigEnd(2);
#endif

    AMREX_D_TERM(const auto& is_periodic_x = lev_geom.isPeriodic(0);,
                 const auto& is_periodic_y = lev_geom.isPeriodic(1);,
                 const auto& is_periodic_z = lev_geom.isPeriodic(2););

    // amrex::Print() << " IN STATE_REDISTRIBUTE DOING BOX " << bx << " with ncomp " << ncomp << std::endl;
    // amrex::Print() << " Box(U_in) " << Box(U_in) << std::endl;
    // amrex::Print() << " Box(U_out) " << Box(U_out) << std::endl;

    Box const& bxg1 = amrex::grow(bx,1);
    Box const& bxg2 = amrex::grow(bx,2);
    Box const& bxg3 = amrex::grow(bx,3);

    Box domain_per_grown = domain;
    if (is_periodic_x) domain_per_grown.grow(0,2);
    if (is_periodic_y) domain_per_grown.grow(1,2);
#if (AMREX_SPACEDIM == 3)
    if (is_periodic_z) domain_per_grown.grow(2,2);
#endif

    // Solution at the centroid of my nbhd
    FArrayBox    soln_hat_fab (bxg3,ncomp);
    Array4<Real> soln_hat = soln_hat_fab.array();
    Elixir   eli_soln_hat = soln_hat_fab.elixir();

    // Define Qhat (from Berger and Guliani)
    // Here we initialize soln_hat to equal U_in on all cells in bxg3 so that
    //      in the event we need to use soln_hat 3 cells out from the bx limits
    //      in a modified slope computation, we have a value of soln_hat to use.
    //      But we only modify soln_hat inside bxg2
    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        for (int n = 0; n < ncomp; n++)
            soln_hat(i,j,k,n) = U_in(i,j,k,n);

        if (vfrac(i,j,k) > 0.0 && bxg2.contains(IntVect(AMREX_D_DECL(i,j,k)))
                               && domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k)))) {

            // Start with U_in(i,j,k) itself
            for (int n = 0; n < ncomp; n++)
                soln_hat(i,j,k,n) = U_in(i,j,k,n) * alpha(i,j,k,0) * vfrac(i,j,k);

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];

                if (domain_per_grown.contains(IntVect(AMREX_D_DECL(r,s,t))))
                {
                    for (int n = 0; n < ncomp; n++)
                        soln_hat(i,j,k,n) += U_in(r,s,t,n) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);
                }
            }
            for (int n = 0; n < ncomp; n++)
                soln_hat(i,j,k,n) /= nbhd_vol(i,j,k);
        }
    });

    amrex::ParallelFor(bxg1,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (vfrac(i,j,k) > 0.0)
        {
            int num_nbors = itracker(i,j,k,0);

            if (itracker(i,j,k,0) == 0)
            {
                if (bx.contains(IntVect(AMREX_D_DECL(i,j,k))))
                {
                    for (int n = 0; n < ncomp; n++)
                        amrex::Gpu::Atomic::Add(&U_out(i,j,k,n),alpha(i,j,k,0)*nrs(i,j,k)*soln_hat(i,j,k,n));
                }

            } else {

                for (int n = 0; n < ncomp; n++)
                {
                    bool extdir_ilo = (d_bcrec_ptr[n].lo(0) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].lo(0) == amrex::BCType::hoextrap);
                    bool extdir_ihi = (d_bcrec_ptr[n].hi(0) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].hi(0) == amrex::BCType::hoextrap);
                    bool extdir_jlo = (d_bcrec_ptr[n].lo(1) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].lo(1) == amrex::BCType::hoextrap);
                    bool extdir_jhi = (d_bcrec_ptr[n].hi(1) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].hi(1) == amrex::BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                    bool extdir_klo = (d_bcrec_ptr[n].lo(2) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].lo(2) == amrex::BCType::hoextrap);
                    bool extdir_khi = (d_bcrec_ptr[n].hi(2) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].hi(2) == amrex::BCType::hoextrap);
#endif
                    // Initialize so that the slope stencil goes from -1:1 in each diretion
                    int nx = 1; int ny = 1; int nz = 1;

                    // Do we have enough extent in each coordinate direction to use the 3x3x3 stencil
                    //    or do we need to enlarge it?
                    AMREX_D_TERM(Real x_max = -1.e30; Real x_min = 1.e30;,
                                 Real y_max = -1.e30; Real y_min = 1.e30;,
                                 Real z_max = -1.e30; Real z_min = 1.e30;);

                    Real slope_stencil_min_width = 0.5;
#if (AMREX_SPACEDIM == 2)
                    int kk = 0;
#elif (AMREX_SPACEDIM == 3)
                    for(int kk(-1); kk<=1; kk++)
#endif
                    {
                     for(int jj(-1); jj<=1; jj++)
                      for(int ii(-1); ii<=1; ii++)
                        if (flag(i,j,k).isConnected(ii,jj,kk))
                        {
                            int r = i+ii; int s = j+jj; int t = k+kk;

                            x_max = amrex::max(x_max, cent_hat(r,s,t,0)+static_cast<Real>(ii));
                            x_min = amrex::min(x_min, cent_hat(r,s,t,0)+static_cast<Real>(ii));
                            y_max = amrex::max(y_max, cent_hat(r,s,t,1)+static_cast<Real>(jj));
                            y_min = amrex::min(y_min, cent_hat(r,s,t,1)+static_cast<Real>(jj));
#if (AMREX_SPACEDIM == 3)
                            z_max = amrex::max(z_max, cent_hat(r,s,t,2)+static_cast<Real>(kk));
                            z_min = amrex::min(z_min, cent_hat(r,s,t,2)+static_cast<Real>(kk));
#endif
                        }
                    }
                    // If we need to grow the stencil, we let it be -nx:nx in the x-direction,
                    //    for example.   Note that nx,ny,nz are either 1 or 2
                    if ( (x_max-x_min) < slope_stencil_min_width ) nx = 2;
                    if ( (y_max-y_min) < slope_stencil_min_width ) ny = 2;
#if (AMREX_SPACEDIM == 3)
                    if ( (z_max-z_min) < slope_stencil_min_width ) nz = 2;
#endif

                    amrex::GpuArray<amrex::Real,AMREX_SPACEDIM> slopes_eb;
                    if (nx*ny*nz == 1)
                        // Compute slope using 3x3x3 stencil
                        slopes_eb = amrex_calc_slopes_extdir_eb(
                                                    i,j,k,n,soln_hat,cent_hat,vfrac,
                                                    AMREX_D_DECL(fcx,fcy,fcz),flag,
                                                    AMREX_D_DECL(extdir_ilo, extdir_jlo, extdir_klo),
                                                    AMREX_D_DECL(extdir_ihi, extdir_jhi, extdir_khi),
                                                    AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                                    AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                                    max_order);
                    else
                    {
                        // Compute slope using grown stencil (no larger than 5x5x5)
                        slopes_eb = amrex_calc_slopes_extdir_eb_grown(
                                                    i,j,k,n,AMREX_D_DECL(nx,ny,nz),
                                                    soln_hat,cent_hat,vfrac,
                                                    AMREX_D_DECL(fcx,fcy,fcz),flag,
                                                    AMREX_D_DECL(extdir_ilo, extdir_jlo, extdir_klo),
                                                    AMREX_D_DECL(extdir_ihi, extdir_jhi, extdir_khi),
                                                    AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                                    AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                                    max_order);
                    }

                    // We do the limiting separately because this limiter limits the slope based on the values
                    //    extrapolated to the cell centroid (cent_hat) locations - unlike the limiter in amrex
                    //    which bases the limiting on values extrapolated to the face centroids.
                    amrex::GpuArray<amrex::Real,AMREX_SPACEDIM> lim_slope =
                        amrex_calc_centroid_limiter(i,j,k,n,soln_hat,flag,slopes_eb,cent_hat);

                    AMREX_D_TERM(lim_slope[0] *= slopes_eb[0];,
                                 lim_slope[1] *= slopes_eb[1];,
                                 lim_slope[2] *= slopes_eb[2];);

                    // Add to the cell itself
                    if (bx.contains(IntVect(AMREX_D_DECL(i,j,k))))
                    {
                        Real update = soln_hat(i,j,k,n);
                        AMREX_D_TERM(update += lim_slope[0] * (ccent(i,j,k,0)-cent_hat(i,j,k,0));,
                                     update += lim_slope[1] * (ccent(i,j,k,1)-cent_hat(i,j,k,1));,
                                     update += lim_slope[2] * (ccent(i,j,k,2)-cent_hat(i,j,k,2)););
                        amrex::Gpu::Atomic::Add(&U_out(i,j,k,n),alpha(i,j,k,0)*nrs(i,j,k)*update);
                    } // if bx contains

                    // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
                    for (int i_nbor = 1; i_nbor <= num_nbors; i_nbor++)
                    {
                        int r = i+imap[itracker(i,j,k,i_nbor)];
                        int s = j+jmap[itracker(i,j,k,i_nbor)];
                        int t = k+kmap[itracker(i,j,k,i_nbor)];

                        if (bx.contains(IntVect(AMREX_D_DECL(r,s,t))))
                        {
                            Real update = soln_hat(i,j,k,n);
                            AMREX_D_TERM(update += lim_slope[0] * (ccent(r,s,t,0)-cent_hat(i,j,k,0) + static_cast<Real>(r-i));,
                                         update += lim_slope[1] * (ccent(r,s,t,1)-cent_hat(i,j,k,1) + static_cast<Real>(s-j));,
                                         update += lim_slope[2] * (ccent(r,s,t,2)-cent_hat(i,j,k,2) + static_cast<Real>(t-k)););
                            amrex::Gpu::Atomic::Add(&U_out(r,s,t,n),alpha(i,j,k,1)*update);
                        } // if bx contains
                    } // i_nbor
                } // n
            } // num_nbors
        } // vfrac
    });

    amrex::ParallelFor(bx,ncomp,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // This seems to help with a compiler issue ...
            Real denom = 1. / (nrs(i,j,k) + 1.e-40);
            U_out(i,j,k,n) *= denom;
        }
        else
        {
            U_out(i,j,k,n) = 1.e40;
        }
    });

#if 0
    //
    // This tests whether the redistribution procedure was conservative --
    //      only use if bx is the whole domain
    //
    {
      for (int n = 0; n < ncomp; n++)
      {
        Real sum1(0);
        Real sum2(0);
#if (AMREX_SPACEDIM == 2)
        int k = 0;
#else
        for (int k = bx.smallEnd(2); k <= domain.bigEnd(2); k++)
#endif
        for (int j = bx.smallEnd(1); j <= domain.bigEnd(1); j++)
        for (int i = bx.smallEnd(0); i <= domain.bigEnd(0); i++)
        {
            sum1 += vfrac(i,j,k)*U_in(i,j,k,n);
            sum2 += vfrac(i,j,k)*U_out(i,j,k,n);
        }
        if (std::abs(sum1-sum2) > 1.e-8 * sum1 && std::abs(sum1-sum2) > 1.e-8)
        {
           printf("SUMS DO NOT MATCH IN STATE REDIST : %f %f ",sum1,sum2);
           amrex::Abort();
        }
      }
    }
#endif
}